

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O2

int basic_type_init(coda_cdf_type *type,int32_t data_type,int32_t num_elements)

{
  int iVar1;
  int iVar2;
  coda_type_number *type_00;
  coda_native_type read_type;
  coda_type_class type_class;
  int64_t iStack_30;
  
  type_class = coda_integer_class;
  iStack_30 = 1;
  read_type = coda_native_type_int8;
  switch(data_type) {
  case 1:
    break;
  case 2:
    iStack_30 = 2;
    read_type = data_type;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0017e921_caseD_3:
    coda_set_error(-100,"invalid CDF data type (%d)",data_type);
    return -1;
  case 4:
    iStack_30 = 4;
    read_type = data_type;
    break;
  case 8:
    read_type = coda_native_type_int64;
    goto LAB_0017e96c;
  case 0xb:
    read_type = coda_native_type_uint8;
    break;
  case 0xc:
    iStack_30 = 2;
    read_type = coda_native_type_uint16;
    break;
  case 0xe:
    read_type = coda_native_type_uint32;
    goto LAB_0017e973;
  case 0x15:
switchD_0017e921_caseD_15:
    type_class = coda_real_class;
    read_type = coda_native_type_float;
LAB_0017e973:
    iStack_30 = 4;
    break;
  case 0x16:
switchD_0017e921_caseD_16:
    type_class = coda_real_class;
    read_type = coda_native_type_double;
LAB_0017e96c:
    iStack_30 = 8;
    break;
  default:
    switch(data_type) {
    case 0x29:
      break;
    default:
      goto switchD_0017e921_caseD_3;
    case 0x2c:
      goto switchD_0017e921_caseD_15;
    case 0x2d:
      goto switchD_0017e921_caseD_16;
    case 0x33:
    case 0x34:
      read_type = (uint)(num_elements == 1) ^ coda_native_type_string;
      iStack_30 = (int64_t)num_elements;
      type_00 = (coda_type_number *)coda_type_text_new(coda_format_cdf);
      goto LAB_0017e994;
    }
  }
  type_00 = coda_type_number_new(coda_format_cdf,type_class);
LAB_0017e994:
  type->definition = (coda_type *)type_00;
  iVar2 = -1;
  if ((type_00 != (coda_type_number *)0x0) &&
     (iVar1 = coda_type_set_read_type((coda_type *)type_00,read_type), iVar1 == 0)) {
    iVar2 = coda_type_set_byte_size(type->definition,iStack_30);
    iVar2 = -(uint)(iVar2 != 0);
  }
  return iVar2;
}

Assistant:

static int basic_type_init(coda_cdf_type *type, int32_t data_type, int32_t num_elements)
{
    coda_type_class type_class;
    coda_native_type native_type;
    int64_t byte_size;

    switch (data_type)
    {
        case 1:        /* INT1 */
        case 41:       /* BYTE */
            type_class = coda_integer_class;
            native_type = coda_native_type_int8;
            byte_size = 1;
            break;
        case 2:        /* INT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int16;
            byte_size = 2;
            break;
        case 4:        /* INT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int32;
            byte_size = 4;
            break;
        case 8:        /* INT8 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int64;
            byte_size = 8;
            break;
        case 11:       /* UINT1 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint8;
            byte_size = 1;
            break;
        case 12:       /* UINT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint16;
            byte_size = 2;
            break;
        case 14:       /* UINT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint32;
            byte_size = 4;
            break;
        case 21:       /* REAL4 */
        case 44:       /* FLOAT */
            type_class = coda_real_class;
            native_type = coda_native_type_float;
            byte_size = 4;
            break;
        case 22:       /* REAL8 */
        case 45:       /* DOUBLE */
            type_class = coda_real_class;
            native_type = coda_native_type_double;
            byte_size = 8;
            break;
        case 51:       /* CHAR */
        case 52:       /* UCHAR */
            type_class = coda_text_class;
            if (num_elements == 1)
            {
                native_type = coda_native_type_char;
            }
            else
            {
                native_type = coda_native_type_string;
            }
            byte_size = num_elements;
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid CDF data type (%d)", data_type);
            return -1;
    }
    switch (type_class)
    {
        case coda_integer_class:
        case coda_real_class:
            type->definition = (coda_type *)coda_type_number_new(coda_format_cdf, type_class);
            break;
        case coda_text_class:
            type->definition = (coda_type *)coda_type_text_new(coda_format_cdf);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (type->definition == NULL)
    {
        return -1;
    }
    if (coda_type_set_read_type(type->definition, native_type) != 0)
    {
        return -1;
    }
    if (coda_type_set_byte_size(type->definition, byte_size) != 0)
    {
        return -1;
    }
    return 0;
}